

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O0

void JsrtRuntime::Uninitialize(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JsrtRuntime *this;
  ThreadContext *pTVar4;
  JsrtRuntime *currentRuntime;
  ThreadContext *tmpThreadContext;
  ThreadContext *currentThreadContext;
  
  tmpThreadContext = ThreadContext::GetThreadContextList();
  do {
    if (tmpThreadContext == (ThreadContext *)0x0) {
      return;
    }
    bVar2 = ThreadContext::IsScriptActive(tmpThreadContext);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtRuntime.cpp"
                         ,0x3f,"(!currentThreadContext->IsScriptActive())",
                         "!currentThreadContext->IsScriptActive()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this = (JsrtRuntime *)ThreadContext::GetJSRTRuntime(tmpThreadContext);
    pTVar4 = JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::Next
                       (&tmpThreadContext->
                         super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>);
    CloseContexts(this);
    RentalThreadContextManager::DestroyThreadContext(tmpThreadContext);
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsrtRuntime>
              (&Memory::HeapAllocator::Instance,this);
    tmpThreadContext = pTVar4;
  } while( true );
}

Assistant:

void JsrtRuntime::Uninitialize()
{
    ThreadContext* currentThreadContext = ThreadContext::GetThreadContextList();
    ThreadContext* tmpThreadContext;
    while (currentThreadContext)
    {
        Assert(!currentThreadContext->IsScriptActive());
        JsrtRuntime* currentRuntime = static_cast<JsrtRuntime*>(currentThreadContext->GetJSRTRuntime());
        tmpThreadContext = currentThreadContext;
        currentThreadContext = currentThreadContext->Next();

#ifdef CHAKRA_STATIC_LIBRARY
        // xplat-todo: Cleanup staticlib shutdown. This only shuts down threads.
        // Other closing contexts / finalizers having trouble with current
        // runtime/context.
        RentalThreadContextManager::DestroyThreadContext(tmpThreadContext);
#else
        currentRuntime->CloseContexts();
        RentalThreadContextManager::DestroyThreadContext(tmpThreadContext);
        HeapDelete(currentRuntime);
#endif
    }
}